

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::verifyResult
               (ConstPixelBufferAccess *access)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  Vector<bool,_4> local_74;
  undefined1 local_70 [16];
  Vector<float,_4> local_60;
  undefined1 local_50 [8];
  Vec4 diff;
  int x;
  int y;
  Vec4 reference;
  Vec4 threshold;
  ConstPixelBufferAccess *access_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(reference.m_data + 2),0.1,0.1,0.1,0.1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,1.0,1.0,1.0,1.0);
  diff.m_data[3] = 0.0;
  do {
    fVar1 = diff.m_data[3];
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(access);
    if (iVar3 <= (int)fVar1) {
      return true;
    }
    for (diff.m_data[2] = 0.0; fVar1 = diff.m_data[2],
        iVar3 = tcu::ConstPixelBufferAccess::getWidth(access), (int)fVar1 < iVar3;
        diff.m_data[2] = (float)((int)diff.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_70,(int)access,(int)diff.m_data[2],
                 (int)diff.m_data[3]);
      tcu::operator-((tcu *)&local_60,(Vector<float,_4> *)local_70,(Vector<float,_4> *)&x);
      tcu::abs<float,4>((tcu *)local_50,&local_60);
      tcu::lessThanEqual<float,4>
                ((tcu *)&local_74,(Vector<float,_4> *)local_50,
                 (Vector<float,_4> *)(reference.m_data + 2));
      bVar2 = tcu::boolAll<4>(&local_74);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    diff.m_data[3] = (float)((int)diff.m_data[3] + 1);
  } while( true );
}

Assistant:

bool UniformLocationCase::verifyResult (const tcu::ConstPixelBufferAccess& access)
{
	using tcu::Vec4;

	const Vec4 threshold (0.1f, 0.1f, 0.1f, 0.1f);
	const Vec4 reference (1.0f, 1.0f, 1.0f, 1.0f);

	for (int y = 0; y < access.getHeight(); y++)
	{
		for (int x = 0; x < access.getWidth(); x++)
		{
			const Vec4 diff = abs(access.getPixel(x, y) - reference);

			if (!boolAll(lessThanEqual(diff, threshold)))
				return false;
		}
	}

	return true;
}